

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
immutable::rrb_details::create_concat_plan<int,false,6>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          rrb_details *this,ref<immutable::rrb_details::internal_node<int,_false>_> *all,
          uint32_t *top_len)

{
  uint uVar1;
  uint32_t uVar2;
  value_type vVar3;
  internal_node<int,_false> *piVar4;
  reference pvVar5;
  uint *puVar6;
  uint local_60;
  uint local_5c;
  uint32_t j;
  uint local_54;
  value_type local_50;
  uint32_t min_size;
  uint32_t remaining_nodes;
  uint32_t i;
  uint32_t shuffled_len;
  uint32_t optimal_slots;
  uint32_t size;
  uint32_t i_1;
  uint32_t total_nodes;
  allocator<unsigned_int> local_22;
  undefined1 local_21;
  ref<immutable::rrb_details::internal_node<int,_false>_> *local_20;
  uint32_t *top_len_local;
  ref<immutable::rrb_details::internal_node<int,_false>_> *all_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *node_count;
  
  local_21 = 0;
  local_20 = all;
  top_len_local = (uint32_t *)this;
  all_local = (ref<immutable::rrb_details::internal_node<int,_false>_> *)__return_storage_ptr__;
  piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                     ((ref<immutable::rrb_details::internal_node<int,_false>_> *)this);
  uVar1 = piVar4->len;
  std::allocator<unsigned_int>::allocator(&local_22);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)uVar1,&local_22);
  std::allocator<unsigned_int>::~allocator(&local_22);
  size = 0;
  for (optimal_slots = 0; uVar2 = optimal_slots,
      piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                         ((ref<immutable::rrb_details::internal_node<int,_false>_> *)top_len_local),
      uVar2 < piVar4->len; optimal_slots = optimal_slots + 1) {
    piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                       ((ref<immutable::rrb_details::internal_node<int,_false>_> *)top_len_local);
    piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                       (piVar4->child + optimal_slots);
    uVar2 = piVar4->len;
    shuffled_len = uVar2;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)optimal_slots);
    *pvVar5 = uVar2;
    size = shuffled_len + size;
  }
  i = (size - 1 >> 6) + 1;
  piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                     ((ref<immutable::rrb_details::internal_node<int,_false>_> *)top_len_local);
  remaining_nodes = piVar4->len;
  min_size = 0;
  for (; i + 2 < remaining_nodes; remaining_nodes = remaining_nodes - 1) {
    while (pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (__return_storage_ptr__,(ulong)min_size), 0x3f < *pvVar5) {
      min_size = min_size + 1;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)min_size);
    local_50 = *pvVar5;
    do {
      vVar3 = local_50;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(ulong)(min_size + 1));
      j = vVar3 + *pvVar5;
      local_5c = 0x40;
      puVar6 = std::min<unsigned_int>(&j,&local_5c);
      uVar1 = *puVar6;
      local_54 = uVar1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(ulong)min_size);
      vVar3 = local_50;
      *pvVar5 = uVar1;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(ulong)(min_size + 1));
      local_50 = (vVar3 + *pvVar5) - local_54;
      local_60 = min_size + 1;
      min_size = local_60;
    } while (local_50 != 0);
    local_50 = 0;
    for (; local_60 < remaining_nodes - 1; local_60 = local_60 + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(ulong)(local_60 + 1));
      vVar3 = *pvVar5;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(ulong)local_60);
      *pvVar5 = vVar3;
    }
    min_size = min_size - 1;
  }
  *(uint32_t *)&local_20->ptr = remaining_nodes;
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint32_t> create_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, uint32_t* top_len)
      {
      std::vector<uint32_t> node_count(all->len);

      uint32_t total_nodes = 0;
      for (uint32_t i = 0; i < all->len; i++)
        {
        const uint32_t size = all->child[i]->len;
        node_count[i] = size;
        total_nodes += size;
        }

      const uint32_t optimal_slots = ((total_nodes - 1) / bits<N>::rrb_branching) + 1;

      uint32_t shuffled_len = all->len;
      uint32_t i = 0;
      while (optimal_slots + bits<N>::rrb_extras < shuffled_len)
        {

        // Skip over all nodes satisfying the invariant.
        while (node_count[i] > bits<N>::rrb_branching - bits<N>::rrb_invariant)
          {
          i++;
          }

        // Found short node, so redistribute over the next nodes
        uint32_t remaining_nodes = node_count[i];
        do
          {
          const uint32_t min_size = std::min<uint32_t>(remaining_nodes + node_count[i + 1], bits<N>::rrb_branching);
          node_count[i] = min_size;
          remaining_nodes = remaining_nodes + node_count[i + 1] - min_size;
          i++;
          } while (remaining_nodes > 0);

          // Shuffle up remaining node sizes
          for (uint32_t j = i; j < shuffled_len - 1; j++)
            {
            node_count[j] = node_count[j + 1]; // Could use memmove here I guess
            }
          shuffled_len--;
          i--;
        }

      *top_len = shuffled_len;
      return node_count;
      }